

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall
QStyleOptionToolButton::QStyleOptionToolButton(QStyleOptionToolButton *this,int version)

{
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  QStyleOptionComplex::QStyleOptionComplex
            ((QStyleOptionComplex *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  QFlags<QStyleOptionToolButton::ToolButtonFeature>::QFlags
            ((QFlags<QStyleOptionToolButton::ToolButtonFeature> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),(ToolButtonFeature)((ulong)in_RDI >> 0x20));
  QIcon::QIcon((QIcon *)(in_RDI + 0x50));
  QSize::QSize((QSize *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QString::QString((QString *)0x41d55e);
  *(undefined4 *)(in_RDI + 0x78) = 2;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  QPoint::QPoint((QPoint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QFont::QFont((QFont *)(in_RDI + 0x88));
  return;
}

Assistant:

QStyleOptionToolButton::QStyleOptionToolButton(int version)
    : QStyleOptionComplex(version, SO_ToolButton), features(None), arrowType(Qt::DownArrow)
    , toolButtonStyle(Qt::ToolButtonIconOnly)

{
}